

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O0

StringPiece muduo::ProcessInfo::procname(string *stat)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char in_DIL;
  StringPiece SVar4;
  size_t rp;
  size_t lp;
  StringPiece name;
  undefined1 local_10 [12];
  
  StringPiece::StringPiece((StringPiece *)local_10);
  uVar1 = std::__cxx11::string::find(in_DIL,0x28);
  uVar2 = std::__cxx11::string::rfind(in_DIL,0x29);
  if (((uVar1 != 0xffffffffffffffff) && (uVar2 != 0xffffffffffffffff)) && (uVar1 < uVar2)) {
    lVar3 = std::__cxx11::string::data();
    StringPiece::set((StringPiece *)local_10,(char *)(lVar3 + uVar1 + 1),
                     ((int)uVar2 - (int)uVar1) + -1);
  }
  SVar4._12_4_ = 0;
  SVar4.ptr_ = (char *)local_10._0_8_;
  SVar4.length_ = local_10._8_4_;
  return SVar4;
}

Assistant:

StringPiece ProcessInfo::procname(const string& stat)
{
  StringPiece name;
  size_t lp = stat.find('(');
  size_t rp = stat.rfind(')');
  if (lp != string::npos && rp != string::npos && lp < rp)
  {
    name.set(stat.data()+lp+1, static_cast<int>(rp-lp-1));
  }
  return name;
}